

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# er.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  time_t tVar5;
  ostream *poVar6;
  long in_RSI;
  int in_EDI;
  double dVar7;
  int j;
  int i_2;
  int i_1;
  ostream *output_stream;
  ofstream file_stream;
  string arg;
  int i;
  bool undirected;
  bool edge_filtration;
  float density;
  int n;
  char *filename;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  ostream *local_2a8;
  int local_274;
  int local_270;
  int local_26c;
  ostream local_260 [535];
  allocator local_49;
  string local_48 [32];
  int local_28;
  byte local_22;
  byte local_21;
  float local_20;
  int local_1c;
  char *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = (char *)0x0;
  local_1c = -1;
  local_20 = 1.0;
  local_21 = 0;
  local_22 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  for (local_28 = 0; local_28 < local_8; local_28 = local_28 + 1) {
    pcVar1 = *(char **)(local_10 + (long)local_28 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if (bVar2) {
      print_usage_and_exit(0);
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      if (bVar2) {
        local_28 = local_28 + 1;
        dVar7 = atof(*(char **)(local_10 + (long)local_28 * 8));
        local_20 = (float)dVar7;
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        if (bVar2) {
          local_21 = 1;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          if (bVar2) {
            local_22 = 1;
          }
          else if (local_1c < 0) {
            local_1c = atoi(*(char **)(local_10 + (long)local_28 * 8));
          }
          else {
            local_18 = *(char **)(local_10 + (long)local_28 * 8);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  if (local_1c == -1) {
    print_usage_and_exit(0);
  }
  std::ofstream::ofstream(local_260,local_18,0x10);
  if ((local_18 != (char *)0x0) && (bVar3 = std::ios::fail(), (bVar3 & 1) != 0)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
    poVar6 = std::operator<<(poVar6,local_18);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  if (local_18 == (char *)0x0) {
    local_2a8 = (ostream *)&std::cout;
  }
  else {
    local_2a8 = local_260;
  }
  poVar6 = std::operator<<(local_2a8,"dim 0");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_26c = 0; local_26c < local_1c; local_26c = local_26c + 1) {
    poVar6 = (ostream *)std::ostream::operator<<(local_2a8,0);
    std::operator<<(poVar6," ");
  }
  std::ostream::operator<<(local_2a8,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_2a8,"dim 1");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_270 = 0; local_274 = local_270, local_270 < local_1c; local_270 = local_270 + 1) {
    while (local_274 = local_274 + 1, local_274 < local_1c) {
      if (((local_20 == 1.0) && (!NAN(local_20))) ||
         (iVar4 = rand(), (float)(iVar4 % 1000) / 1000.0 < local_20)) {
        poVar6 = (ostream *)std::ostream::operator<<(local_2a8,local_270);
        poVar6 = std::operator<<(poVar6," ");
        std::ostream::operator<<(poVar6,local_274);
        if ((local_21 & 1) != 0) {
          poVar6 = std::operator<<(local_2a8," ");
          iVar4 = rand();
          std::ostream::operator<<(poVar6,(double)(iVar4 % 100) / 100.0 + 1.0);
        }
        std::ostream::operator<<(local_2a8,std::endl<char,std::char_traits<char>>);
      }
      if (((local_22 & 1) == 0) &&
         (((local_20 == 1.0 && (!NAN(local_20))) ||
          (iVar4 = rand(), (float)(iVar4 % 1000) / 1000.0 < local_20)))) {
        poVar6 = (ostream *)std::ostream::operator<<(local_2a8,local_274);
        poVar6 = std::operator<<(poVar6," ");
        std::ostream::operator<<(poVar6,local_270);
        if ((local_21 & 1) != 0) {
          poVar6 = std::operator<<(local_2a8," ");
          iVar4 = rand();
          std::ostream::operator<<(poVar6,(double)(iVar4 % 100) / 100.0 + 1.0);
        }
        std::ostream::operator<<(local_2a8,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  if (local_18 != (char *)0x0) {
    std::ofstream::close();
    poVar6 = std::operator<<((ostream *)&std::cout,"Wrote directed graph to ");
    poVar6 = std::operator<<(poVar6,local_18);
    poVar6 = std::operator<<(poVar6,".");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_260);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {

	const char* filename = nullptr;
	int n = -1;
	float density = 1.0;
	bool edge_filtration = false;
	bool undirected = false;

	for (int i = 0; i < argc; ++i) {
		const std::string arg(argv[i]);
		if (arg == "--help") {
			print_usage_and_exit(0);
		} else if (arg == "--density") {
			density = float(atof(argv[++i]));
		} else if (arg == "--random-edge-filtration") {
			edge_filtration = true;
		} else if (arg == "--undirected") {
			undirected = true;
		} else {
			if (n > -1) {
				filename = argv[i];
			} else
				n = atoi(argv[i]);
		}
	}

	if (n == -1) { print_usage_and_exit(-1); }

	std::ofstream file_stream(filename);
	if (filename && file_stream.fail()) {
		std::cerr << "couldn't open file " << filename << std::endl;
		exit(-1);
	}

	srand((unsigned int)time(NULL));
	std::ostream& output_stream = filename ? file_stream : std::cout;
	output_stream << "dim 0" << std::endl;
	for (int i = 0; i < n; i++) output_stream << 0 << " ";
	output_stream << std::endl;

	output_stream << "dim 1" << std::endl;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << i << " " << j;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}

			if (undirected) continue;

			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << j << " " << i;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}
		}
	}

	if (filename) {
		file_stream.close();
		std::cout << "Wrote directed graph to " << filename << "." << std::endl;
	}
}